

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

RK_S32 __thiscall mpp_list::del_at_tail(mpp_list *this,void *data,RK_S32 size)

{
  RK_S32 local_20;
  RK_S32 ret;
  RK_S32 size_local;
  void *data_local;
  mpp_list *this_local;
  
  local_20 = -0x16;
  if ((this->head != (mpp_list_node *)0x0) && (this->count != 0)) {
    _list_del_node_no_lock(this->head->prev,data,size);
    this->count = this->count + -1;
    local_20 = 0;
  }
  return local_20;
}

Assistant:

RK_S32 mpp_list::del_at_tail(void *data, RK_S32 size)
{
    RK_S32 ret = -EINVAL;
    if (head && count) {
        _list_del_node_no_lock(head->prev, data, size);
        count--;
        ret = 0;
    }
    return ret;
}